

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextimagehandler.cpp
# Opt level: O0

QUrl findAtNxFileOrResource
               (QString *baseFileName,qreal targetDevicePixelRatio,qreal *sourceDevicePixelRatio,
               QString *name)

{
  ulong uVar1;
  QString *in_RCX;
  QStringBuilder<QLatin1String,_QString_&> *in_RSI;
  QUrlPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  bool isResource;
  bool hasFileScheme;
  QUrl url;
  QString localFile;
  QStringBuilder<QLatin1String,_QString_&> *in_stack_fffffffffffffed8;
  QStringBuilder<QLatin1String,_QString_&> *in_stack_fffffffffffffee0;
  QUrlPrivate *this;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QString *in_stack_ffffffffffffff00;
  qreal *local_f0;
  undefined6 in_stack_ffffffffffffff20;
  byte bVar3;
  byte bVar4;
  undefined1 local_88 [96];
  QUrl local_28;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QString::QString((QString *)0x872f19);
  local_28.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_28,(QString *)in_RSI,TolerantMode);
  bVar4 = 0;
  bVar3 = 0;
  uVar1 = QUrl::isLocalFile();
  if ((uVar1 & 1) == 0) {
    in_stack_fffffffffffffee0 = in_RSI;
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)this,(size_t)in_RSI);
    local_f0 = (qreal *)QVar2.m_data;
    uVar1 = QString::startsWith((QLatin1String *)in_stack_fffffffffffffee0,
                                (CaseSensitivity)QVar2.m_size);
    if ((uVar1 & 1) == 0) {
      QString::operator=(&local_20,(QString *)in_RSI);
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)this,(size_t)in_stack_fffffffffffffee0);
      bVar3 = QString::startsWith((QLatin1String *)in_RSI,(CaseSensitivity)QVar2.m_size);
      bVar3 = bVar3 & 1;
      in_stack_fffffffffffffed8 = in_RSI;
    }
    else {
      QString::sliced(in_stack_ffffffffffffff00,
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::operator=((QString *)in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
      QString::~QString((QString *)0x873017);
      bVar3 = 1;
    }
  }
  else {
    QUrl::toLocalFile();
    QString::operator=((QString *)in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
    QString::~QString((QString *)0x872f90);
    bVar4 = 1;
  }
  qt_findAtNxFile(in_RCX,(qreal)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_ffffffffffffff20)),local_f0);
  QString::operator=((QString *)in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
  QString::~QString((QString *)0x8730b3);
  if ((bVar4 & 1) == 0) {
    if ((bVar3 & 1) == 0) {
      QUrl::QUrl((QUrl *)this,(QString *)in_RCX,TolerantMode);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1((char *)this,(size_t)in_stack_fffffffffffffee0);
      operator+(&in_stack_fffffffffffffee0->a,(QString *)in_stack_fffffffffffffed8);
      QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffed8);
      QUrl::QUrl((QUrl *)this,(QString *)local_88,TolerantMode);
      QString::~QString((QString *)0x873148);
    }
  }
  else {
    QUrl::fromLocalFile((QString *)this);
  }
  QUrl::~QUrl(&local_28);
  QString::~QString((QString *)0x873185);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QUrl)in_RDI;
}

Assistant:

static inline QUrl findAtNxFileOrResource(const QString &baseFileName,
                                          qreal targetDevicePixelRatio,
                                          qreal *sourceDevicePixelRatio,
                                          QString *name)
{
    // qt_findAtNxFile expects a file name that can be tested with QFile::exists.
    // so if the format.name() is a file:/ or qrc:/ URL, then we need to strip away the schema.
    QString localFile;
    const QUrl url(baseFileName);
    bool hasFileScheme = false;
    bool isResource = false;
    if (url.isLocalFile()) {
        localFile = url.toLocalFile();
        hasFileScheme = true;
    } else if (baseFileName.startsWith("qrc:/"_L1)) {
        // QFile::exists() can only handle ":/file.txt"
        localFile = baseFileName.sliced(3);
        isResource = true;
    } else {
        localFile = baseFileName;
        isResource = baseFileName.startsWith(":/"_L1);
    }
    *name = qt_findAtNxFile(localFile, targetDevicePixelRatio, sourceDevicePixelRatio);

    if (hasFileScheme)
        return QUrl::fromLocalFile(*name);
    if (isResource)
        return QUrl("qrc"_L1 + *name);
    return QUrl(*name);
}